

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setCategoryRatesWithIndex
          (BeagleCPUImpl<float,_1,_0> *this,int categoryRatesIndex,double *inCategoryRates)

{
  double **ppdVar1;
  int iVar2;
  double *pdVar3;
  size_t __size;
  
  iVar2 = -5;
  if ((-1 < categoryRatesIndex) && (categoryRatesIndex < this->kEigenDecompCount)) {
    ppdVar1 = this->gCategoryRates;
    pdVar3 = ppdVar1[(uint)categoryRatesIndex];
    __size = (long)this->kCategoryCount << 3;
    if (pdVar3 == (double *)0x0) {
      pdVar3 = (double *)malloc(__size);
      ppdVar1[(uint)categoryRatesIndex] = pdVar3;
      pdVar3 = this->gCategoryRates[(uint)categoryRatesIndex];
      if (pdVar3 == (double *)0x0) {
        return -2;
      }
    }
    memcpy(pdVar3,inCategoryRates,__size);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryRatesWithIndex(int categoryRatesIndex,
                                                                 const double* inCategoryRates) {
    if (categoryRatesIndex < 0 || categoryRatesIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gCategoryRates[categoryRatesIndex] == NULL) {
        gCategoryRates[categoryRatesIndex] = (double*) malloc(sizeof(double) * kCategoryCount);
        if (gCategoryRates[categoryRatesIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    memcpy(gCategoryRates[categoryRatesIndex], inCategoryRates, sizeof(double) * kCategoryCount);
    return BEAGLE_SUCCESS;
}